

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashList_DeleteKVPair(ktxHashList *pHead,char *key)

{
  long *plVar1;
  uint *puVar2;
  ktxHashList pkVar3;
  UT_hash_table *pUVar4;
  UT_hash_bucket *pUVar5;
  UT_hash_handle *pUVar6;
  long lVar7;
  size_t sVar8;
  byte *pbVar9;
  uint uVar10;
  int iVar11;
  ktxHashList pkVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ktx_error_code_e kVar18;
  
  if (key == (char *)0x0 || pHead == (ktxHashList *)0x0) {
    kVar18 = KTX_INVALID_VALUE;
  }
  else {
    pkVar3 = *pHead;
    if (pkVar3 == (ktxHashList)0x0) {
      kVar18 = KTX_SUCCESS;
    }
    else {
      sVar8 = strlen(key);
      pbVar9 = (byte *)(key + 0xb);
      uVar17 = 0x9e3779b9;
      uVar10 = 0xfeedbeef;
      uVar14 = 0x9e3779b9;
      uVar16 = sVar8 & 0xffffffff;
      while (uVar15 = (uint)uVar16, 0xb < uVar15) {
        iVar11 = uVar14 + (int)(char)pbVar9[-7] + (char)pbVar9[-6] * 0x100 +
                 (uint)pbVar9[-4] * 0x1000000 + (char)pbVar9[-5] * 0x10000;
        uVar10 = uVar10 + (int)(char)pbVar9[-3] + (char)pbVar9[-2] * 0x100 +
                 (uint)*pbVar9 * 0x1000000 + (char)pbVar9[-1] * 0x10000;
        uVar17 = uVar10 >> 0xd ^
                 ((uVar17 + (int)(char)pbVar9[-0xb] + (char)pbVar9[-10] * 0x100 +
                  (uint)pbVar9[-8] * 0x1000000 + (char)pbVar9[-9] * 0x10000) - iVar11) - uVar10;
        uVar14 = uVar17 << 8 ^ (iVar11 - uVar10) - uVar17;
        uVar10 = uVar14 >> 0xd ^ (uVar10 - uVar17) - uVar14;
        uVar17 = uVar10 >> 0xc ^ (uVar17 - uVar14) - uVar10;
        uVar14 = uVar17 << 0x10 ^ (uVar14 - uVar10) - uVar17;
        uVar10 = uVar14 >> 5 ^ (uVar10 - uVar17) - uVar14;
        uVar17 = uVar10 >> 3 ^ (uVar17 - uVar14) - uVar10;
        uVar14 = uVar17 << 10 ^ (uVar14 - uVar10) - uVar17;
        uVar10 = uVar14 >> 0xf ^ (uVar10 - uVar17) - uVar14;
        pbVar9 = pbVar9 + 0xc;
        uVar16 = (ulong)(uVar15 - 0xc);
      }
      uVar10 = uVar10 + (int)sVar8;
      switch(uVar15) {
      case 0xb:
        uVar10 = (uint)pbVar9[-1] * 0x1000000 + uVar10;
      case 10:
        uVar10 = (char)pbVar9[-2] * 0x10000 + uVar10;
      case 9:
        uVar10 = (char)pbVar9[-3] * 0x100 + uVar10;
      case 8:
        uVar14 = (uint)pbVar9[-4] * 0x1000000 + uVar14;
      case 7:
        uVar14 = (char)pbVar9[-5] * 0x10000 + uVar14;
      case 6:
        uVar14 = (char)pbVar9[-6] * 0x100 + uVar14;
      case 5:
        uVar14 = (int)(char)pbVar9[-7] + uVar14;
      case 4:
        uVar17 = (uint)pbVar9[-8] * 0x1000000 + uVar17;
      case 3:
        uVar17 = (char)pbVar9[-9] * 0x10000 + uVar17;
      case 2:
        uVar17 = (char)pbVar9[-10] * 0x100 + uVar17;
      case 1:
        uVar17 = (int)(char)pbVar9[-0xb] + uVar17;
      default:
        uVar17 = uVar10 >> 0xd ^ (uVar17 - uVar10) - uVar14;
        uVar15 = uVar17 << 8 ^ (uVar14 - uVar10) - uVar17;
        uVar14 = uVar15 >> 0xd ^ (uVar10 - uVar17) - uVar15;
        uVar10 = uVar14 >> 0xc ^ (uVar17 - uVar15) - uVar14;
        uVar17 = uVar10 << 0x10 ^ (uVar15 - uVar14) - uVar10;
        uVar14 = uVar17 >> 5 ^ (uVar14 - uVar10) - uVar17;
        uVar10 = uVar14 >> 3 ^ (uVar10 - uVar17) - uVar14;
        uVar17 = uVar10 << 10 ^ (uVar17 - uVar14) - uVar10;
        pUVar4 = (pkVar3->hh).tbl;
        pUVar5 = pUVar4->buckets;
        pUVar6 = pUVar5[pUVar4->num_buckets - 1 & (uVar17 >> 0xf ^ uVar14 - (uVar10 + uVar17))].
                 hh_head;
        if (pUVar6 == (UT_hash_handle *)0x0) {
          lVar13 = 0;
        }
        else {
          lVar13 = (long)pUVar6 - pUVar4->hho;
        }
        kVar18 = KTX_SUCCESS;
      }
      while (lVar13 != 0) {
        if ((*(int *)(lVar13 + 0x50) == (int)sVar8) &&
           (iVar11 = bcmp(*(void **)(lVar13 + 0x48),key,sVar8 & 0xffffffff), iVar11 == 0)) {
          lVar7 = *(long *)(lVar13 + 0x28);
          if ((lVar7 == 0) && (*(long *)(lVar13 + 0x30) == 0)) {
            free(pUVar5);
            free(((*pHead)->hh).tbl);
            *pHead = (ktxHashList)0x0;
            return KTX_SUCCESS;
          }
          if (lVar13 == (long)pUVar4->tail - pUVar4->hho) {
            pUVar4->tail = (UT_hash_handle *)(pUVar4->hho + lVar7);
          }
          pkVar3 = *(ktxHashList *)(lVar13 + 0x30);
          if (lVar7 == 0) {
            *pHead = pkVar3;
            pkVar12 = pkVar3;
          }
          else {
            *(ktxHashList *)(lVar7 + 0x10 + (((*pHead)->hh).tbl)->hho) = pkVar3;
            pkVar12 = *pHead;
          }
          if (pkVar3 != (ktxHashList)0x0) {
            *(undefined8 *)((long)&pkVar3->key + ((pkVar12->hh).tbl)->hho) =
                 *(undefined8 *)(lVar13 + 0x28);
            pkVar12 = *pHead;
          }
          pUVar4 = (pkVar12->hh).tbl;
          uVar17 = pUVar4->num_buckets - 1 & *(uint *)(lVar13 + 0x54);
          pUVar5 = pUVar4->buckets;
          pUVar5[uVar17].count = pUVar5[uVar17].count - 1;
          if (pUVar5[uVar17].hh_head == (UT_hash_handle *)(lVar13 + 0x20)) {
            pUVar5[uVar17].hh_head = *(UT_hash_handle **)(lVar13 + 0x40);
          }
          lVar7 = *(long *)(lVar13 + 0x38);
          lVar13 = *(long *)(lVar13 + 0x40);
          if (lVar7 != 0) {
            *(long *)(lVar7 + 0x20) = lVar13;
          }
          if (lVar13 != 0) {
            *(long *)(lVar13 + 0x18) = lVar7;
          }
          puVar2 = &(((*pHead)->hh).tbl)->num_items;
          *puVar2 = *puVar2 - 1;
          return KTX_SUCCESS;
        }
        plVar1 = (long *)(lVar13 + 0x40);
        lVar13 = 0;
        if (*plVar1 != 0) {
          lVar13 = *plVar1 - pUVar4->hho;
        }
      }
    }
  }
  return kVar18;
}

Assistant:

KTX_error_code
ktxHashList_DeleteKVPair(ktxHashList* pHead, const char* key)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: pointer to target entry. */
        if (kv != NULL)
            HASH_DEL(*pHead, kv);
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}